

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

void xmlSchematronParseTestReportMsg(xmlSchematronParserCtxtPtr ctxt,xmlNodePtr con)

{
  xmlNode *node;
  int iVar1;
  xmlElementType xVar2;
  xmlChar *str;
  xmlXPathCompExprPtr comp;
  _xmlNode **pp_Var3;
  xmlChar *in_R9;
  
  pp_Var3 = &con->children;
  do {
    node = *pp_Var3;
    if (node == (xmlNode *)0x0) {
      return;
    }
    xVar2 = node->type;
    if (1 < xVar2 - XML_TEXT_NODE) {
      if (xVar2 == XML_ELEMENT_NODE) {
        if (node->ns != (xmlNs *)0x0) {
          iVar1 = xmlStrEqual(node->name,"name");
          if (iVar1 == 0) {
LAB_001aaf0b:
            xVar2 = node->type;
            goto LAB_001aaf0e;
          }
          iVar1 = xmlStrEqual(node->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron");
            if (iVar1 == 0) goto LAB_001aaf0b;
          }
        }
      }
      else {
LAB_001aaf0e:
        if ((xVar2 == XML_ELEMENT_NODE) && (node->ns != (xmlNs *)0x0)) {
          iVar1 = xmlStrEqual(node->name,(xmlChar *)"value-of");
          if (iVar1 != 0) {
            iVar1 = xmlStrEqual(node->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron");
              if (iVar1 == 0) goto LAB_001aaff6;
            }
            str = xmlGetNoNsProp(node,"select");
            if (str == (xmlChar *)0x0) {
              xmlSchematronPErr(ctxt,node,0x71d,"value-of has no select attribute",(xmlChar *)0x0,
                                in_R9);
            }
            else {
              comp = xmlXPathCtxtCompile(ctxt->xctxt,str);
              if (comp == (xmlXPathCompExprPtr)0x0) {
                xmlSchematronPErr(ctxt,node,0x71d,"Failed to compile select expression %s",str,in_R9
                                 );
              }
              xmlXPathFreeCompExpr(comp);
            }
            (*xmlFree)(str);
          }
        }
      }
    }
LAB_001aaff6:
    pp_Var3 = &node->next;
  } while( true );
}

Assistant:

static void
xmlSchematronParseTestReportMsg(xmlSchematronParserCtxtPtr ctxt, xmlNodePtr con)
{
    xmlNodePtr child;
    xmlXPathCompExprPtr comp;

    child = con->children;
    while (child != NULL) {
        if ((child->type == XML_TEXT_NODE) ||
            (child->type == XML_CDATA_SECTION_NODE))
            /* Do Nothing */
            {}
        else if (IS_SCHEMATRON(child, "name")) {
            /* Do Nothing */
        } else if (IS_SCHEMATRON(child, "value-of")) {
            xmlChar *select;

            select = xmlGetNoNsProp(child, BAD_CAST "select");

            if (select == NULL) {
                xmlSchematronPErr(ctxt, child,
                                  XML_SCHEMAV_ATTRINVALID,
                                  "value-of has no select attribute",
                                  NULL, NULL);
            } else {
                /*
                 * try first to compile the test expression
                 */
                comp = xmlXPathCtxtCompile(ctxt->xctxt, select);
                if (comp == NULL) {
                    xmlSchematronPErr(ctxt, child,
                                      XML_SCHEMAV_ATTRINVALID,
                                      "Failed to compile select expression %s",
                                      select, NULL);
                }
                xmlXPathFreeCompExpr(comp);
            }
            xmlFree(select);
        }
        child = child->next;
    }
}